

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O3

int main(void)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  cJSON *pcVar4;
  undefined8 uVar5;
  bool bVar6;
  long lVar7;
  long in_FS_OFFSET;
  int ids [4];
  char *strings [7];
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  char *local_78;
  char *pcStack_70;
  char *local_68;
  char *pcStack_60;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = cJSON_Version();
  printf("Version: %s\n",uVar3);
  local_48 = "Saturday";
  local_58 = "Thursday";
  pcStack_50 = "Friday";
  local_68 = "Tuesday";
  pcStack_60 = "Wednesday";
  local_78 = "Sunday";
  pcStack_70 = "Monday";
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0xffffffff00000000;
  uStack_a0 = 0x100000000;
  local_88 = 1;
  local_b8 = 0x74;
  uStack_b4 = 0x3af;
  uStack_b0 = 0xea;
  uStack_ac = 0x9789;
  pcVar4 = (cJSON *)cJSON_CreateObject();
  uVar3 = cJSON_CreateString("Jack (\"Bee\") Nimble");
  cJSON_AddItemToObject(pcVar4,"name",uVar3);
  uVar3 = cJSON_CreateObject();
  cJSON_AddItemToObject(pcVar4,"format",uVar3);
  cJSON_AddStringToObject(uVar3,"type","rect");
  cJSON_AddNumberToObject(0,uVar3,"width");
  cJSON_AddNumberToObject(0,uVar3,"height");
  cJSON_AddFalseToObject(uVar3,"interlace");
  cJSON_AddNumberToObject(0,uVar3,"frame rate");
  iVar2 = print_preallocated(pcVar4);
  cJSON_Delete(pcVar4);
  if (iVar2 == 0) {
    pcVar4 = (cJSON *)cJSON_CreateStringArray(&local_78,7);
    iVar2 = print_preallocated(pcVar4);
    cJSON_Delete(pcVar4);
    if (iVar2 == 0) {
      lVar7 = 0;
      pcVar4 = (cJSON *)cJSON_CreateArray();
      do {
        uVar3 = cJSON_CreateIntArray((long)&local_a8 + lVar7,3);
        cJSON_AddItemToArray(pcVar4,uVar3);
        lVar7 = lVar7 + 0xc;
      } while (lVar7 != 0x24);
      iVar2 = print_preallocated(pcVar4);
      cJSON_Delete(pcVar4);
      if (iVar2 == 0) {
        pcVar4 = (cJSON *)cJSON_CreateObject();
        uVar3 = cJSON_CreateObject();
        cJSON_AddItemToObject(pcVar4,"Image",uVar3);
        cJSON_AddNumberToObject(0,uVar3,"Width");
        cJSON_AddNumberToObject(0,uVar3,"Height");
        cJSON_AddStringToObject(uVar3,"Title","View from 15th Floor");
        uVar5 = cJSON_CreateObject();
        cJSON_AddItemToObject(uVar3,"Thumbnail",uVar5);
        cJSON_AddStringToObject(uVar5,"Url","http:/*www.example.com/image/481989943");
        cJSON_AddNumberToObject(0,uVar5,"Height");
        cJSON_AddStringToObject(uVar5,"Width","100");
        uVar5 = cJSON_CreateIntArray(&local_b8,4);
        cJSON_AddItemToObject(uVar3,"IDs",uVar5);
        iVar2 = print_preallocated(pcVar4);
        cJSON_Delete(pcVar4);
        if (iVar2 == 0) {
          lVar7 = 0;
          pcVar4 = (cJSON *)cJSON_CreateArray();
          bVar1 = true;
          do {
            bVar6 = bVar1;
            uVar5 = cJSON_CreateObject();
            cJSON_AddItemToArray(pcVar4,uVar5);
            cJSON_AddStringToObject(uVar5,"precision","zip");
            uVar3 = (&DAT_00103d50)[lVar7 * 8];
            cJSON_AddNumberToObject((int)(&DAT_00103d48)[lVar7 * 8],uVar5,"Latitude");
            cJSON_AddNumberToObject((int)uVar3,uVar5,"Longitude");
            cJSON_AddStringToObject(uVar5,"Address","");
            cJSON_AddStringToObject(uVar5,"City",(&PTR_anon_var_dwarf_f1_00103d60)[lVar7 * 8]);
            cJSON_AddStringToObject(uVar5,"State","CA");
            cJSON_AddStringToObject(uVar5,"Zip",(&PTR_anon_var_dwarf_11d_00103d70)[lVar7 * 8]);
            cJSON_AddStringToObject(uVar5,"Country","US");
            lVar7 = 1;
            bVar1 = false;
          } while (bVar6);
          iVar2 = print_preallocated(pcVar4);
          cJSON_Delete(pcVar4);
          if (iVar2 == 0) {
            pcVar4 = (cJSON *)cJSON_CreateObject();
            cJSON_AddNumberToObject(0,pcVar4,"number");
            iVar2 = print_preallocated(pcVar4);
            cJSON_Delete(pcVar4);
            if (iVar2 == 0) {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                return 0;
              }
              __stack_chk_fail();
            }
          }
        }
      }
    }
  }
  exit(1);
}

Assistant:

main(void)
{
    /* print the version */
    printf("Version: %s\n", cJSON_Version());

    /* Now some samplecode for building objects concisely: */
    create_objects();

    return 0;
}